

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolSetATimes(SUNLinearSolver S,void *ATdata,SUNATimesFn ATimes,int myid)

{
  uint uVar1;
  uint in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar2;
  double dVar3;
  double stop_time;
  double start_time;
  int failure;
  int local_4;
  
  dVar2 = get_time();
  uVar1 = SUNLinSolSetATimes(in_RDI,in_RSI,in_RDX);
  sync_device();
  dVar3 = get_time();
  if (uVar1 == 0) {
    if ((in_ECX == 0) && (printf("    PASSED test -- SUNLinSolSetATimes \n"), print_time != 0)) {
      printf("    SUNLinSolSetATimes Time: %22.15e \n \n",dVar3 - dVar2);
    }
    local_4 = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetATimes returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)in_ECX);
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNLinSolSetATimes(SUNLinearSolver S, void* ATdata, SUNATimesFn ATimes,
                            int myid)
{
  int failure;
  double start_time, stop_time;

  /* try calling SetATimes routine: should pass/fail based on expected input */
  start_time = get_time();
  failure    = SUNLinSolSetATimes(S, ATdata, ATimes);
  sync_device();
  stop_time = get_time();

  if (failure)
  {
    printf(">>> FAILED test -- SUNLinSolSetATimes returned %d on Proc %d \n",
           failure, myid);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolSetATimes \n");
    PRINT_TIME("    SUNLinSolSetATimes Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}